

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.cpp
# Opt level: O2

int64_t __thiscall
hta::storage::file::Metric::find_index_before_or_on_binary
          (Metric *this,TimePoint t,int64_t left,int64_t right,int64_t sz)

{
  uint __line;
  TimePoint TVar1;
  uint64_t index;
  char *__assertion;
  uint64_t index_00;
  
  do {
    index_00 = left;
    if (right <= (long)index_00) {
      __assertion = "left < right";
      __line = 0x51;
LAB_00164eeb:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/storage/file/metric.cpp"
                    ,__line,
                    "int64_t hta::storage::file::Metric::find_index_before_or_on_binary(TimePoint, int64_t, int64_t, int64_t)"
                   );
    }
    TVar1 = get_raw_ts(this,index_00);
    if ((long)t.
              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              .__d.__r <
        (long)TVar1.
              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              .__d.__r) {
      __assertion = "get_raw_ts(left) <= t";
      __line = 0x53;
      goto LAB_00164eeb;
    }
    if ((right != sz) &&
       (TVar1 = get_raw_ts(this,right),
       (long)TVar1.
             super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
             .__d.__r <=
       (long)t.
             super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
             .__d.__r)) {
      __assertion = "right == sz || t < get_raw_ts(right)";
      __line = 0x54;
      goto LAB_00164eeb;
    }
    if (right - index_00 == 1) {
      return index_00;
    }
    index = (long)(right + index_00) / 2;
    if (sz <= (long)index) {
      __assertion = "pivot < sz";
      __line = 0x5a;
      goto LAB_00164eeb;
    }
    TVar1 = get_raw_ts(this,index);
    left = index;
    if ((long)t.
              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              .__d.__r <
        (long)TVar1.
              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              .__d.__r) {
      left = index_00;
      right = index;
    }
  } while( true );
}

Assistant:

int64_t Metric::find_index_before_or_on_binary(TimePoint t, int64_t left, int64_t right, int64_t sz)
{
    // left < right means right != 0
    // assumes monotonicity ts(left) < ts(right)
    // invariant ts(left) <= t < ts(right)
    // right can be size() // out of range, but the pivot can never be
    assert(left < right);
    // TODO expensive, use extra debug macro
    assert(get_raw_ts(left) <= t);
    assert(right == sz || t < get_raw_ts(right));
    if (right - left == 1)
    {
        return left;
    }
    auto pivot = (left + right) / 2;
    assert(pivot < sz);
    TimePoint t_pivot = get_raw_ts(pivot);
    if (t >= t_pivot)
    {
        return find_index_before_or_on_binary(t, pivot, right, sz);
    }
    else
    {
        return find_index_before_or_on_binary(t, left, pivot, sz);
    }
}